

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JoinerSession::SendRlyTx
          (Error *__return_storage_ptr__,JoinerSession *this,ByteArray *aDtlsMessage,
          bool aIncludeKek)

{
  string *this_00;
  ErrorCode EVar1;
  element_type *peVar2;
  ByteArray *__x;
  undefined7 in_register_00000009;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  ByteArray joinerIid;
  Request rlyTx;
  string local_1f0;
  undefined4 local_1cc;
  ByteArray *local_1c8;
  ByteArray *local_1c0;
  string local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  size_type sStack_160;
  long local_158;
  ulong local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  string local_f8;
  string local_d8;
  Message local_b8;
  
  local_1cc = (undefined4)CONCAT71(in_register_00000009,aIncludeKek);
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_190 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_190;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_1c0 = aDtlsMessage;
  coap::Message::Message(&local_b8,kNonConfirmable,kPost);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/c/tx","");
  coap::Message::SetUriPath((Error *)local_188,&local_b8,&local_1f0);
  __return_storage_ptr__->mCode = local_188._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  EVar1 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &aStack_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_001bd174;
  tlv::Tlv::Tlv((Tlv *)&local_1f0,kJoinerUdpPort,this->mJoinerUdpPort,kMeshCoP);
  AppendTlv((Error *)local_188,&local_b8,(Tlv *)&local_1f0);
  __return_storage_ptr__->mCode = local_188._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  EVar1 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &aStack_170) {
    operator_delete(local_180._M_p);
  }
  if ((void *)local_1f0._M_string_length != (void *)0x0) {
    operator_delete((void *)local_1f0._M_string_length);
  }
  if (EVar1 != kNone) goto LAB_001bd174;
  tlv::Tlv::Tlv((Tlv *)&local_1f0,kJoinerRouterLocator,this->mJoinerRouterLocator,kMeshCoP);
  AppendTlv((Error *)local_188,&local_b8,(Tlv *)&local_1f0);
  __return_storage_ptr__->mCode = local_188._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  EVar1 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &aStack_170) {
    operator_delete(local_180._M_p);
  }
  if ((void *)local_1f0._M_string_length != (void *)0x0) {
    operator_delete((void *)local_1f0._M_string_length);
  }
  if (EVar1 != kNone) goto LAB_001bd174;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8,&this->mJoinerId);
  *local_1b8._M_dataplus._M_p = *local_1b8._M_dataplus._M_p ^ 2;
  tlv::Tlv::Tlv((Tlv *)&local_1f0,kJoinerIID,(ByteArray *)&local_1b8,kMeshCoP);
  AppendTlv((Error *)local_188,&local_b8,(Tlv *)&local_1f0);
  __return_storage_ptr__->mCode = local_188._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  local_1c8 = (ByteArray *)CONCAT44(local_1c8._4_4_,__return_storage_ptr__->mCode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &aStack_170) {
    operator_delete(local_180._M_p);
  }
  if ((void *)local_1f0._M_string_length != (void *)0x0) {
    operator_delete((void *)local_1f0._M_string_length);
  }
  if ((byte *)local_1b8._M_dataplus._M_p != (byte *)0x0) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((int)local_1c8 != 0) goto LAB_001bd174;
  tlv::Tlv::Tlv((Tlv *)&local_1f0,kJoinerDtlsEncapsulation,local_1c0,kMeshCoP);
  local_1c8 = &this->mJoinerId;
  AppendTlv((Error *)local_188,&local_b8,(Tlv *)&local_1f0);
  __return_storage_ptr__->mCode = local_188._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
  EVar1 = __return_storage_ptr__->mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &aStack_170) {
    operator_delete(local_180._M_p);
  }
  if ((void *)local_1f0._M_string_length != (void *)0x0) {
    operator_delete((void *)local_1f0._M_string_length);
  }
  if (EVar1 != kNone) goto LAB_001bd174;
  if ((byte)local_1cc == '\0') {
LAB_001bd003:
    __x = local_1c8;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    coap::CoapSecure::SendRequest
              (&this->mCommImpl->mBrClient,&local_b8,(ResponseHandler *)&local_118);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"joiner-session","");
    ::fmt::v10::detail::
    check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_bool_&,_FMT_COMPILE_STRING,_0>
              ();
    DtlsSession::GetStateString_abi_cxx11_
              (&local_d8,
               (this->mDtlsSession).
               super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_130,__x);
    utils::Hex_abi_cxx11_(&local_f8,(utils *)&local_130,aBytes);
    local_158 = (long)(local_1c0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_1c0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
    local_148 = (ulong)(byte)local_1cc;
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p;
    aStack_170._M_allocated_capacity = local_d8._M_string_length;
    aStack_170._8_8_ = local_f8._M_dataplus._M_p;
    sStack_160 = local_f8._M_string_length;
    fmt.size_ = 0x74dde;
    fmt.data_ = (char *)0x54;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_188;
    local_188 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1b8,
               (v10 *)
               "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}"
               ,fmt,args);
    Log(kDebug,&local_1f0,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_001bd15b:
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  else {
    peVar2 = (this->mDtlsSession).
             super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (peVar2->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)&local_1f0,kJoinerRouterKEK,&peVar2->mKek,kMeshCoP);
      AppendTlv((Error *)local_188,&local_b8,(Tlv *)&local_1f0);
      __return_storage_ptr__->mCode = local_188._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
      EVar1 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &aStack_170) {
        operator_delete(local_180._M_p);
      }
      if ((void *)local_1f0._M_string_length != (void *)0x0) {
        operator_delete((void *)local_1f0._M_string_length);
      }
      if (EVar1 != kNone) goto LAB_001bd174;
      goto LAB_001bd003;
    }
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_1b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1f0,(v10 *)"DTLS KEK is not available",(string_view)ZEXT816(0x19),args_00);
    local_188._0_4_ = 0xf;
    local_180._M_p = (pointer)&aStack_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_1f0._M_dataplus._M_p,
               local_1f0._M_string_length + local_1f0._M_dataplus._M_p);
    __return_storage_ptr__->mCode = local_188._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_180);
    local_d8._M_dataplus._M_p = local_180._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &aStack_170) goto LAB_001bd15b;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
LAB_001bd174:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error JoinerSession::SendRlyTx(const ByteArray &aDtlsMessage, bool aIncludeKek)
{
    Error         error;
    coap::Request rlyTx{coap::Type::kNonConfirmable, coap::Code::kPost};

    SuccessOrExit(error = rlyTx.SetUriPath(uri::kRelayTx));

    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerUdpPort, GetJoinerUdpPort()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterLocator, GetJoinerRouterLocator()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerIID, GetJoinerIid()}));
    SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerDtlsEncapsulation, aDtlsMessage}));

    if (aIncludeKek)
    {
        VerifyOrExit(!mDtlsSession->GetKek().empty(), error = ERROR_INVALID_STATE("DTLS KEK is not available"));
        SuccessOrExit(error = AppendTlv(rlyTx, {tlv::Type::kJoinerRouterKEK, mDtlsSession->GetKek()}));
    }

    mCommImpl.mBrClient.SendRequest(rlyTx, nullptr);

    LOG_DEBUG(LOG_REGION_JOINER_SESSION,
              "session(={}) sent RLY_TX.ntf: SessionState={}, joinerID={}, length={}, includeKek={}",
              static_cast<void *>(this), mDtlsSession->GetStateString(), utils::Hex(GetJoinerId()), aDtlsMessage.size(),
              aIncludeKek);

exit:
    return error;
}